

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall
QGridLayout::addItem
          (QGridLayout *this,QLayoutItem *item,int row,int column,int rowSpan,int columnSpan,
          Alignment alignment)

{
  QGridLayoutPrivate *this_00;
  QGridBox *this_01;
  QLayoutItem *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int in_stack_00000008;
  QGridBox *b;
  QGridLayoutPrivate *d;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffff8c;
  int col2;
  int col1;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGridLayout *)0x335a7c);
  this_01 = (QGridBox *)operator_new(0x18);
  col2 = in_stack_00000008;
  QGridBox::QGridBox(this_01,in_RSI);
  col1 = col2;
  QGridBox::setAlignment((QGridBox *)0x335abd,(Alignment)in_stack_ffffffffffffff8c.i);
  QGridLayoutPrivate::add(this_00,this_01,(int)((ulong)lVar1 >> 0x20),(int)lVar1,col1,col2);
  (**(code **)(*in_RDI + 0x70))();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayout::addItem(QLayoutItem *item, int row, int column, int rowSpan, int columnSpan, Qt::Alignment alignment)
{
    Q_D(QGridLayout);
    QGridBox *b = new QGridBox(item);
    b->setAlignment(alignment);
    d->add(b, row, (rowSpan < 0) ? -1 : row + rowSpan - 1, column, (columnSpan < 0) ? -1 : column + columnSpan - 1);
    invalidate();
}